

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
sznet::net::Connector::Connector(Connector *this,EventLoop *loop,InetAddress *serverAddr)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  LogStream *pLVar5;
  char **ppcVar6;
  undefined1 auVar7 [24];
  SourceFile file;
  Logger local_fe8;
  
  (this->super_enable_shared_from_this<sznet::net::Connector>)._M_weak_this.
  super___weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<sznet::net::Connector>)._M_weak_this.
  super___weak_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_loop = loop;
  uVar2 = *(undefined8 *)((long)&serverAddr->field_0 + 8);
  uVar3 = *(undefined8 *)((long)&serverAddr->field_0 + 0xc);
  uVar4 = *(undefined8 *)((long)&serverAddr->field_0 + 0x14);
  *(undefined8 *)&(this->m_serverAddr).field_0 = *(undefined8 *)&serverAddr->field_0;
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 8) = uVar2;
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 0xc) = uVar3;
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 0x14) = uVar4;
  this->m_connect = false;
  this->m_state = kDisconnected;
  (this->m_newConnectionCallback)._M_invoker = (_Invoker_type)0x0;
  auVar7 = SUB3224(ZEXT832(0) << 0x20,8);
  this->m_channel =
       (unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>)
       SUB328(ZEXT832(0) << 0x20,0);
  (this->m_newConnectionCallback).super__Function_base._M_functor = (_Any_data)auVar7._0_16_;
  (this->m_newConnectionCallback).super__Function_base._M_manager = (_Manager_type)auVar7._16_8_;
  this->m_retryDelayMs = 500;
  if (g_logLevel < 2) {
    file._8_8_ = 0xd;
    file.m_data = "Connector.cpp";
    Logger::Logger(&local_fe8,file,0x19,DEBUG,"Connector");
    if (5 < (uint)(((int)&local_fe8 + 0xfb0) - (int)local_fe8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fe8.m_impl.m_stream.m_buffer.m_cur,"ctor[",5);
      local_fe8.m_impl.m_stream.m_buffer.m_cur = local_fe8.m_impl.m_stream.m_buffer.m_cur + 5;
    }
    pLVar5 = LogStream::operator<<(&local_fe8.m_impl.m_stream,this);
    pcVar1 = (pLVar5->m_buffer).m_cur;
    ppcVar6 = &(pLVar5->m_buffer).m_cur;
    if (((int)ppcVar6 - (int)pcVar1 & 0xfffffffeU) != 0) {
      *pcVar1 = ']';
      *ppcVar6 = *ppcVar6 + 1;
    }
    Logger::~Logger(&local_fe8);
  }
  return;
}

Assistant:

Connector::Connector(EventLoop* loop, const InetAddress& serverAddr): 
	m_loop(loop),
	m_serverAddr(serverAddr),
	m_connect(false),
	m_state(kDisconnected),
	m_retryDelayMs(kInitRetryDelayMs)
{
	LOG_DEBUG << "ctor[" << this << "]";
}